

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::getPerturbedPose
               (translation_t *position,rotation_t *rotation,translation_t *perturbedPosition,
               rotation_t *perturbedRotation,double amplitude)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  int iVar5;
  size_t i;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  cayley_t cayley;
  cayley_t local_78;
  double local_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  double dStack_30;
  double dStack_28;
  double local_20;
  
  dVar1 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  (perturbedPosition->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
  .array[0] = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
  (perturbedPosition->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
  .array[1] = dVar1;
  (perturbedPosition->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
  .array[2] = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
  math::rot2cayley(&local_78,rotation);
  lVar6 = 0;
  do {
    dVar1 = (perturbedPosition->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[lVar6];
    iVar5 = rand();
    dVar4 = (double)iVar5 / 2147483647.0 + -0.5;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = amplitude;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar4 + dVar4;
    auVar2 = vfmadd132sd_fma(auVar7,auVar9,auVar2);
    (perturbedPosition->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
    m_data.array[lVar6] = auVar2._0_8_;
    dVar1 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[lVar6];
    iVar5 = rand();
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    dVar1 = (double)iVar5 / 2147483647.0 + -0.5;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = amplitude;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1 + dVar1;
    auVar2 = vfmadd132sd_fma(auVar8,auVar10,auVar3);
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [lVar6] = auVar2._0_8_;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  math::cayley2rot(&local_78);
  (perturbedRotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
  .array[8] = local_20;
  (perturbedRotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
  .array[0] = local_60;
  (perturbedRotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
  .array[1] = dStack_58;
  (perturbedRotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
  .array[2] = dStack_50;
  (perturbedRotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
  .array[3] = dStack_48;
  (perturbedRotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
  .array[4] = dStack_40;
  (perturbedRotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
  .array[5] = dStack_38;
  (perturbedRotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
  .array[6] = dStack_30;
  (perturbedRotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
  .array[7] = dStack_28;
  return;
}

Assistant:

void
opengv::getPerturbedPose(
    const translation_t & position,
    const rotation_t & rotation,
    translation_t & perturbedPosition,
    rotation_t & perturbedRotation,
    double amplitude )
{
  perturbedPosition = position;
  cayley_t cayley = math::rot2cayley(rotation);
  for( size_t i = 0; i < 3; i++ )
  {
    perturbedPosition[i] =
        perturbedPosition[i] +
        (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*amplitude;
    cayley[i] =
        cayley[i] + (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*amplitude;
  }
  perturbedRotation = math::cayley2rot(cayley);
}